

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_create_meta(lyd_node *parent,lyd_meta **meta,lys_module *mod,char *name,size_t name_len,
                      char *value,size_t value_len,ly_bool is_utf8,ly_bool store_only,
                      ly_bool *dynamic,LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,
                      lysc_node *ctx_node,ly_bool clear_dflt,ly_bool *incomplete)

{
  lyd_meta *plVar1;
  LY_ERR LVar2;
  lysc_ext_instance *ext;
  lyd_meta *meta_00;
  lyd_meta *plVar3;
  lysc_type *ant_type;
  
  if ((parent == (lyd_node *)0x0 && meta == (lyd_meta **)0x0) || (mod == (lys_module *)0x0)) {
    __assert_fail("(parent || meta) && mod",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x549,
                  "LY_ERR lyd_create_meta(struct lyd_node *, struct lyd_meta **, const struct lys_module *, const char *, size_t, const char *, size_t, ly_bool, ly_bool, ly_bool *, LY_VALUE_FORMAT, void *, uint32_t, const struct lysc_node *, ly_bool, ly_bool *)"
                 );
  }
  ext = lyd_get_meta_annotation(mod,name,name_len);
  if (ext == (lysc_ext_instance *)0x0) {
    ly_vlog(mod->ctx,(char *)0x0,LYVE_REFERENCE,
            "Annotation definition for attribute \"%s:%.*s\" not found.",mod->name,
            name_len & 0xffffffff,name);
    return LY_EINVAL;
  }
  meta_00 = (lyd_meta *)calloc(1,0x48);
  if (meta_00 == (lyd_meta *)0x0) {
    ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_create_meta");
    return LY_EMEM;
  }
  meta_00->parent = parent;
  meta_00->annotation = ext;
  lyplg_ext_get_storage(ext,0x2e0000,8,&ant_type);
  LVar2 = lyd_value_store(mod->ctx,&meta_00->value,ant_type,value,value_len,is_utf8,store_only,
                          dynamic,format,prefix_data,hints,ctx_node,incomplete);
  if ((LVar2 != LY_SUCCESS) ||
     (LVar2 = lydict_insert(mod->ctx,name,name_len,&meta_00->name), LVar2 != LY_SUCCESS)) {
    free(meta_00);
    return LVar2;
  }
  if (parent == (lyd_node *)0x0) {
    plVar1 = *meta;
    if (*meta == (lyd_meta *)0x0) goto LAB_00120474;
    do {
      plVar3 = plVar1;
      plVar1 = plVar3->next;
    } while (plVar1 != (lyd_meta *)0x0);
    plVar3->next = meta_00;
  }
  else {
    lyd_insert_meta(parent,meta_00,clear_dflt);
  }
  if (meta == (lyd_meta **)0x0) {
    return LY_SUCCESS;
  }
LAB_00120474:
  *meta = meta_00;
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_create_meta(struct lyd_node *parent, struct lyd_meta **meta, const struct lys_module *mod, const char *name,
        size_t name_len, const char *value, size_t value_len, ly_bool is_utf8, ly_bool store_only, ly_bool *dynamic,
        LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, const struct lysc_node *ctx_node, ly_bool clear_dflt,
        ly_bool *incomplete)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_ext_instance *ant = NULL;
    const struct lysc_type *ant_type;
    struct lyd_meta *mt, *last;

    assert((parent || meta) && mod);

    ant = lyd_get_meta_annotation(mod, name, name_len);
    if (!ant) {
        /* attribute is not defined as a metadata annotation (RFC 7952) */
        LOGVAL(mod->ctx, LYVE_REFERENCE, "Annotation definition for attribute \"%s:%.*s\" not found.",
                mod->name, (int)name_len, name);
        ret = LY_EINVAL;
        goto cleanup;
    }

    mt = calloc(1, sizeof *mt);
    LY_CHECK_ERR_GOTO(!mt, LOGMEM(mod->ctx); ret = LY_EMEM, cleanup);
    mt->parent = parent;
    mt->annotation = ant;
    lyplg_ext_get_storage(ant, LY_STMT_TYPE, sizeof ant_type, (const void **)&ant_type);
    ret = lyd_value_store(mod->ctx, &mt->value, ant_type, value, value_len, is_utf8, store_only, dynamic, format, prefix_data, hints,
            ctx_node, incomplete);
    LY_CHECK_ERR_GOTO(ret, free(mt), cleanup);
    ret = lydict_insert(mod->ctx, name, name_len, &mt->name);
    LY_CHECK_ERR_GOTO(ret, free(mt), cleanup);

    /* insert as the last attribute */
    if (parent) {
        lyd_insert_meta(parent, mt, clear_dflt);
    } else if (*meta) {
        for (last = *meta; last->next; last = last->next) {}
        last->next = mt;
    }

    if (meta) {
        *meta = mt;
    }

cleanup:
    return ret;
}